

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ResolvedConfig * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
          (BumpAllocator *this,ConfigBlockSymbol *args,InstanceSymbol *args_1)

{
  InstanceSymbol *rootInstance;
  ConfigBlockSymbol *in_RDX;
  ResolvedConfig *in_RSI;
  BumpAllocator *in_RDI;
  
  rootInstance = (InstanceSymbol *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::ResolvedConfig::ResolvedConfig(in_RSI,in_RDX,rootInstance);
  return (ResolvedConfig *)rootInstance;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }